

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SDMMCAnalyzerResults::GenerateFrameTabularText
          (SDMMCAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char *str_desc;
  char str_arg [33];
  char local_78 [8];
  char str_cmd [33];
  Frame local_48 [8];
  Frame frame;
  uint local_38;
  undefined4 uStack_34;
  uint local_30;
  undefined4 uStack_2c;
  char local_28;
  DisplayBase display_base_local;
  U64 frame_index_local;
  SDMMCAnalyzerResults *this_local;
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_48);
  if (local_28 == '\x01') {
    AnalyzerHelpers::GetNumberString(CONCAT44(uStack_34,local_38),Decimal,6,local_78,0x21);
    AnalyzerHelpers::GetNumberString
              (CONCAT44(uStack_2c,local_30),display_base,0x20,(char *)&str_desc,0x21);
    SDMMCHelpers::MMCCommandDescription(local_38,local_30);
    AnalyzerResults::AddTabularText((char *)this,"CMD",local_78,", arg=",(char *)&str_desc," ");
  }
  Frame::~Frame(local_48);
  return;
}

Assistant:

void SDMMCAnalyzerResults::GenerateFrameTabularText(U64 frame_index, DisplayBase display_base)
{
	ClearTabularText();
	Frame frame = GetFrame(frame_index);
	if (frame.mType != FRAMETYPE_COMMAND)
		return;
	char str_cmd[33];
	char str_arg[33];
	const char *str_desc;
	AnalyzerHelpers::GetNumberString(frame.mData1, Decimal, 6, str_cmd, sizeof(str_cmd));
	AnalyzerHelpers::GetNumberString(frame.mData2, display_base, 32, str_arg, sizeof(str_arg));
	str_desc = SDMMCHelpers::MMCCommandDescription(frame.mData1, frame.mData2);
	AddTabularText("CMD", str_cmd, ", arg=", str_arg, " ", str_desc);
}